

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.h
# Opt level: O2

diff_t absl::lts_20250127::time_internal::cctz::detail::impl::ymd_ord(year_t y,month_t m,day_t d)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  long lVar5;
  
  iVar1 = (int)CONCAT71(in_register_00000031,m);
  iVar2 = iVar1 + 0xfffd;
  if (m < '\x03') {
    iVar2 = iVar1 + 9;
  }
  lVar5 = y - (ulong)(m < '\x03');
  lVar4 = lVar5 + -399;
  if (-1 < lVar5) {
    lVar4 = lVar5;
  }
  lVar5 = (lVar4 / 400) * -400 + lVar5;
  uVar3 = iVar2 * 0x99 + 2;
  return lVar5 / -100 +
         (long)(int)CONCAT71(in_register_00000011,d) +
         (long)(short)((int)((uint)(ushort)((short)uVar3 >> 0xf) << 0x10 | uVar3 & 0xffff) / 5) +
         (lVar4 / 400) * 0x23ab1 + lVar5 * 0x16d + lVar5 / 4 + -0xafa6d;
}

Assistant:

CONSTEXPR_F diff_t ymd_ord(year_t y, month_t m, day_t d) noexcept {
  const diff_t eyear = (m <= 2) ? y - 1 : y;
  const diff_t era = (eyear >= 0 ? eyear : eyear - 399) / 400;
  const diff_t yoe = eyear - era * 400;
  const diff_t doy = (153 * (m + (m > 2 ? -3 : 9)) + 2) / 5 + d - 1;
  const diff_t doe = yoe * 365 + yoe / 4 - yoe / 100 + doy;
  return era * 146097 + doe - 719468;
}